

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# img2webp.c
# Opt level: O0

int ReadImage(char *filename,WebPPicture *pic)

{
  int iVar1;
  WebPImageReader p_Var2;
  WebPPicture *in_RSI;
  uint8_t **in_RDI;
  int ok;
  WebPImageReader reader;
  size_t data_size;
  uint8_t *data;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint8_t *in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = ImgIoUtilReadFile((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                            in_RDI,(size_t *)in_RSI);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    p_Var2 = WebPGuessImageReader
                       (in_stack_ffffffffffffffd0,
                        CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    iVar1 = (*p_Var2)((uint8_t *)0x0,0,in_RSI,1,(Metadata *)0x0);
    WebPFree((void *)0x105583);
  }
  return iVar1;
}

Assistant:

static int ReadImage(const char filename[], WebPPicture* const pic) {
  const uint8_t* data = NULL;
  size_t data_size = 0;
  WebPImageReader reader;
  int ok;
#ifdef HAVE_WINCODEC_H
  // Try to decode the file using WIC falling back to the other readers for
  // e.g., WebP.
  ok = ReadPictureWithWIC(filename, pic, 1, NULL);
  if (ok) return 1;
#endif
  if (!ImgIoUtilReadFile(filename, &data, &data_size)) return 0;
  reader = WebPGuessImageReader(data, data_size);
  ok = reader(data, data_size, pic, 1, NULL);
  WebPFree((void*)data);
  return ok;
}